

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::SnapshotEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  int64 val;
  int64 snapId;
  ulong uVar1;
  
  if (evt->EventKind != SnapshotTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  val._0_4_ = evt[1].EventKind;
  val._4_4_ = evt[1].ResultStatus;
  FileWriter::WriteInt64(writer,restoreTime,val,CommaSeparator);
  FileWriter::WriteLengthValue(writer,evt[2].EventKind,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (evt[2].EventKind != Invalid) {
    uVar1 = 0;
    do {
      (*writer->_vptr_FileWriter[0x13])
                (writer,*(undefined8 *)(evt[2].EventTimeStamp + uVar1 * 8),(ulong)(uVar1 != 0));
      uVar1 = uVar1 + 1;
    } while (uVar1 < evt[2].EventKind);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,evt[3].EventKind,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (evt[3].EventKind != Invalid) {
    uVar1 = 0;
    do {
      (*writer->_vptr_FileWriter[0x13])
                (writer,*(undefined8 *)(evt[3].EventTimeStamp + uVar1 * 8),(ulong)(uVar1 != 0));
      uVar1 = uVar1 + 1;
    } while (uVar1 < evt[3].EventKind);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  if ((SnapShot *)evt[1].EventTimeStamp != (SnapShot *)0x0) {
    snapId._0_4_ = evt[1].EventKind;
    snapId._4_4_ = evt[1].ResultStatus;
    SnapShot::EmitSnapshot((SnapShot *)evt[1].EventTimeStamp,snapId,threadContext);
    return;
  }
  return;
}

Assistant:

void SnapshotEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            writer->WriteInt64(NSTokens::Key::restoreTime, snapEvt->RestoreTimestamp, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapEvt->LiveContextCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapEvt->LiveContextCount; ++i)
            {
                writer->WriteNakedLogTag(snapEvt->LiveContextIdArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapEvt->LongLivedRefRootsCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapEvt->LongLivedRefRootsCount; ++i)
            {
                writer->WriteNakedLogTag(snapEvt->LongLivedRefRootsIdArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            if(snapEvt->Snap != nullptr)
            {
                snapEvt->Snap->EmitSnapshot(snapEvt->RestoreTimestamp, threadContext);
            }
        }